

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall
ClipperLib::PolyOffsetBuilder::PolyOffsetBuilder
          (PolyOffsetBuilder *this,Polygons *in_polys,Polygons *out_polys,double delta,
          JoinType jointype,double MiterLimit)

{
  pointer pvVar1;
  long *plVar2;
  pointer pDVar3;
  IntPoint *pt2;
  long lVar4;
  iterator __position;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  ulong uVar10;
  pointer pIVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  ulong __new_size;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  DoublePoint DVar18;
  IntRect r;
  Clipper clpr;
  IntRect local_148;
  Polygons *local_128;
  vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_> *local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [136];
  ClipperBase local_80;
  Polygon local_48;
  
  (this->m_p).
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_p).
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_p).
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120 = &this->normals;
  (this->normals).
  super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->normals).
  super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->normals).
  super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1e-20 <= ABS(delta)) {
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::operator=(&this->m_p,in_polys);
    this->m_delta = delta;
    this->m_jointype = jointype;
    dVar6 = 1.0;
    if (1.0 <= MiterLimit) {
      dVar6 = MiterLimit;
    }
    this->m_RMin = 2.0 / (dVar6 * dVar6);
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::_M_erase_at_end(out_polys,
                      (out_polys->
                      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::resize(out_polys,
             ((long)(in_polys->
                    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(in_polys->
                    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    this->m_i = 0;
    if ((in_polys->
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (in_polys->
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      local_118._8_4_ = in_XMM0_Dc;
      local_118._0_8_ = delta * delta * 3.141592653589793;
      local_118._12_4_ = in_XMM0_Dd;
      uVar10 = 0;
      local_128 = out_polys;
      do {
        this->m_curr_poly =
             (out_polys->
             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + uVar10;
        pvVar1 = (in_polys->
                 super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        __new_size = (long)*(pointer *)
                            ((long)&pvVar1[uVar10].
                                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                    ._M_impl.super__Vector_impl_data + 8) -
                     *(long *)&pvVar1[uVar10].
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data >> 4;
        if (1 < __new_size) {
          plVar2 = *(long **)&(this->m_p).
                              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar10].
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl;
          uVar15 = __new_size - 1;
          if ((*plVar2 == plVar2[uVar15 * 2]) && (plVar2[1] == plVar2[uVar15 * 2 + 1])) {
            __new_size = uVar15;
          }
        }
        dVar5 = Area(pvVar1 + uVar10);
        if (0.0 <= delta) {
          if ((0.0 <= dVar5) || ((double)local_118._0_8_ <= -dVar5)) goto LAB_0066aed4;
        }
        else if ((double)local_118._0_8_ <= dVar5 || dVar5 <= 0.0) {
LAB_0066aed4:
          if ((__new_size != 0) && ((0.0 < delta || (2 < __new_size)))) {
            if (__new_size == 1) {
              local_108._0_8_ = (pointer)0x0;
              local_108._8_8_ = (pointer)0x0;
              local_108._16_8_ = (pointer)0x0;
              BuildArc((Polygon *)&local_148,
                       (in_polys->
                       super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[this->m_i].
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_start,0.0,6.283185307179586,delta);
              uVar8 = local_108._16_8_;
              uVar7 = local_108._0_8_;
              local_108._0_8_ = local_148.left;
              local_108._8_8_ = local_148.top;
              local_108._16_8_ = local_148.right;
              local_148.left = 0;
              local_148.top = 0;
              local_148.right = 0;
              if (((pointer)uVar7 != (pointer)0x0) &&
                 (operator_delete((void *)uVar7,uVar8 - uVar7),
                 (pointer)local_148.left != (pointer)0x0)) {
                operator_delete((void *)local_148.left,local_148.right - local_148.left);
              }
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator=
                        ((out_polys->
                         super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + this->m_i,
                         (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                         local_108);
              if ((pointer)local_108._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
              }
            }
            else {
              pDVar3 = (this->normals).
                       super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((this->normals).
                  super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                  ._M_impl.super__Vector_impl_data._M_finish != pDVar3) {
                (this->normals).
                super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                ._M_impl.super__Vector_impl_data._M_finish = pDVar3;
              }
              std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::resize
                        (local_120,__new_size);
              uVar10 = __new_size - 1;
              pt2 = (in_polys->
                    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[this->m_i].
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start;
              DVar18 = GetUnitNormal(pt2 + uVar10,pt2);
              pDVar3 = (this->normals).
                       super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pDVar3[uVar10].X = DVar18.X;
              pDVar3[uVar10].Y = DVar18.Y;
              this->m_j = 0;
              if (uVar10 == 0) {
                this->m_k = 0;
                this->m_j = 0;
              }
              else {
                uVar15 = 0;
                do {
                  lVar4 = *(long *)&(in_polys->
                                    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[this->m_i].
                                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                    ._M_impl.super__Vector_impl_data;
                  DVar18 = GetUnitNormal((IntPoint *)(lVar4 + uVar15 * 0x10),
                                         (IntPoint *)(lVar4 + uVar15 * 0x10 + 0x10));
                  pDVar3 = (this->normals).
                           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pDVar3[uVar15].X = DVar18.X;
                  pDVar3[uVar15].Y = DVar18.Y;
                  uVar15 = this->m_j + 1;
                  this->m_j = uVar15;
                } while (uVar15 < uVar10);
                this->m_k = uVar10;
                this->m_j = 0;
                out_polys = local_128;
                if (__new_size == 0) goto LAB_0066b128;
              }
              out_polys = local_128;
              uVar15 = 0;
              do {
                uVar16 = 0;
                uVar17 = 0x3ff00000;
                if (jointype == jtSquare) {
LAB_0066b0f3:
                  DoSquare(this,(double)CONCAT44(uVar17,uVar16));
                }
                else if (jointype == jtRound) {
                  DoRound(this);
                }
                else if (jointype == jtMiter) {
                  pDVar3 = (this->normals).
                           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  dVar5 = pDVar3[uVar15].X * pDVar3[uVar10].X + pDVar3[uVar15].Y * pDVar3[uVar10].Y
                          + 1.0;
                  this->m_R = dVar5;
                  uVar16 = SUB84(dVar6,0);
                  uVar17 = (undefined4)((ulong)dVar6 >> 0x20);
                  if (dVar5 < this->m_RMin) goto LAB_0066b0f3;
                  DoMiter(this);
                }
                uVar10 = this->m_j;
                this->m_k = uVar10;
                uVar15 = uVar10 + 1;
                this->m_j = uVar15;
              } while (uVar15 < __new_size);
            }
          }
        }
LAB_0066b128:
        uVar10 = this->m_i + 1;
        this->m_i = uVar10;
      } while (uVar10 < (ulong)(((long)(in_polys->
                                       super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(in_polys->
                                       super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    local_80.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80.m_CurrentLM = (LocalMinima *)0x0;
    local_80.m_MinimaList = (LocalMinima *)0x0;
    local_108._0_8_ = &PTR__Clipper_008d9fa8;
    local_80._vptr_ClipperBase = (_func_int **)&PTR__Clipper_008d9ff8;
    local_80.m_UseFullRange = false;
    local_108[0x84] = false;
    local_108._8_8_ = (pointer)0x0;
    local_108._16_8_ = (pointer)0x0;
    local_108._24_8_ = (pointer)0x0;
    local_108._32_8_ = (pointer)0x0;
    local_108._40_8_ = (pointer)0x0;
    local_108._48_8_ = (pointer)0x0;
    local_108._56_8_ = (pointer)0x0;
    local_108._64_8_ = (pointer)0x0;
    local_108._72_8_ = (pointer)0x0;
    local_108._88_8_ = (Scanbeam *)0x0;
    local_108._96_8_ = (TEdge *)0x0;
    local_108._104_8_ = (TEdge *)0x0;
    local_108._112_8_ = (IntersectNode *)0x0;
    local_108[0x78] = false;
    ClipperBase::AddPolygons(&local_80,out_polys,ptSubject);
    if (delta <= 0.0) {
      ClipperBase::GetBounds
                (&local_148,(ClipperBase *)(local_108 + ((pointer)(local_108._0_8_ + -0x20))->Y));
      pIVar11 = (pointer)operator_new(0x40);
      local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_finish = pIVar11 + 4;
      puVar12 = (undefined1 *)((long)&((pointer)(local_148.left + -0x10))->X + 6);
      pIVar11->X = (long64)puVar12;
      pIVar11->Y = local_148.bottom + 10;
      puVar14 = (undefined1 *)((long)(local_148.right + 8) + 2);
      pIVar11[1].X = (long64)puVar14;
      pIVar11[1].Y = local_148.bottom + 10;
      puVar13 = (undefined1 *)((long)&((pointer)(local_148.top + -0x10))->X + 6);
      pIVar11[2].X = (long64)puVar14;
      pIVar11[2].Y = (long64)puVar13;
      pIVar11[3].X = (long64)puVar12;
      pIVar11[3].Y = (long64)puVar13;
      local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_start = pIVar11;
      local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ClipperBase::AddPolygon
                ((ClipperBase *)(local_108 + ((pointer)(local_108._0_8_ + -0x20))->Y),&local_48,
                 ptSubject);
      bVar9 = Clipper::Execute((Clipper *)local_108,ctUnion,out_polys,pftNegative,pftNegative);
      __position._M_current =
           (out_polys->
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      if (bVar9) {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::_M_erase(out_polys,__position);
        ReversePolygons(out_polys);
      }
      else {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::_M_erase_at_end(out_polys,__position._M_current);
      }
      operator_delete(pIVar11,0x40);
    }
    else {
      bVar9 = Clipper::Execute((Clipper *)local_108,ctUnion,out_polys,pftPositive,pftPositive);
      if (!bVar9) {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::_M_erase_at_end(out_polys,
                          (out_polys->
                          super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      }
    }
    Clipper::~Clipper((Clipper *)local_108,&Clipper::VTT);
    ClipperBase::~ClipperBase(&local_80);
  }
  else {
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::operator=(out_polys,in_polys);
  }
  return;
}

Assistant:

PolyOffsetBuilder(const Polygons& in_polys, Polygons& out_polys,
  double delta, JoinType jointype, double MiterLimit)
{
    //nb precondition - out_polys != ptsin_polys
    if (NEAR_ZERO(delta))
    {
        out_polys = in_polys;
        return;
    }

    this->m_p = in_polys;
    this->m_delta = delta;
    this->m_jointype = jointype;
    if (MiterLimit <= 1) MiterLimit = 1;
    m_RMin = 2/(MiterLimit*MiterLimit);
 
    double deltaSq = delta*delta;
    out_polys.clear();
    out_polys.resize(in_polys.size());
    for (m_i = 0; m_i < in_polys.size(); m_i++)
    {
        m_curr_poly = &out_polys[m_i];
        size_t len = in_polys[m_i].size();
        if (len > 1 && m_p[m_i][0].X == m_p[m_i][len - 1].X &&
            m_p[m_i][0].Y == m_p[m_i][len-1].Y) len--;

        //when 'shrinking' polygons - to minimize artefacts
        //strip those polygons that have an area < pi * delta^2 ...
        double a1 = Area(in_polys[m_i]);
        if (delta < 0) { if (a1 > 0 && a1 < deltaSq *pi) len = 0; }
        else if (a1 < 0 && -a1 < deltaSq *pi) len = 0; //holes have neg. area

        if (len == 0 || (len < 3 && delta <= 0))
          continue;
        else if (len == 1)
        {
            Polygon arc;
            arc = BuildArc(in_polys[m_i][len-1], 0, 2 * pi, delta);
            out_polys[m_i] = arc;
            continue;
        }

        //build normals ...
        normals.clear();
        normals.resize(len);
        normals[len-1] = GetUnitNormal(in_polys[m_i][len-1], in_polys[m_i][0]);
        for (m_j = 0; m_j < len -1; ++m_j)
            normals[m_j] = GetUnitNormal(in_polys[m_i][m_j], in_polys[m_i][m_j+1]);
        
        m_k = len -1;
        for (m_j = 0; m_j < len; ++m_j)
        {
          switch (jointype)
          {
            case jtMiter:
            {
              m_R = 1 + (normals[m_j].X*normals[m_k].X + 
                normals[m_j].Y*normals[m_k].Y);
              if (m_R >= m_RMin) DoMiter(); else DoSquare(MiterLimit);
              break;
            }
            case jtSquare: DoSquare(); break;
            case jtRound: DoRound(); break;
          }
        m_k = m_j;
        }
    }

    //finally, clean up untidy corners using Clipper ...
    Clipper clpr;
    clpr.AddPolygons(out_polys, ptSubject);
    if (delta > 0)
    {
        if (!clpr.Execute(ctUnion, out_polys, pftPositive, pftPositive))
            out_polys.clear();
    }
    else
    {
        IntRect r = clpr.GetBounds();
        Polygon outer(4);
        outer[0] = IntPoint(r.left - 10, r.bottom + 10);
        outer[1] = IntPoint(r.right + 10, r.bottom + 10);
        outer[2] = IntPoint(r.right + 10, r.top - 10);
        outer[3] = IntPoint(r.left - 10, r.top - 10);

        clpr.AddPolygon(outer, ptSubject);
        if (clpr.Execute(ctUnion, out_polys, pftNegative, pftNegative))
        {
            out_polys.erase(out_polys.begin());
            ReversePolygons(out_polys);

        } else
            out_polys.clear();
    }
}